

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

uint __thiscall
capnp::compiler::NodeTranslator::StructLayout::Union::addNewDataLocation(Union *this,uint lgSize)

{
  RemoveConst<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation> **ppRVar1;
  DataLocation *pDVar2;
  DataLocation *pDVar3;
  uint uVar4;
  RemoveConst<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation> RVar5;
  size_t newSize;
  
  uVar4 = (*this->parent->_vptr_StructOrGroup[1])();
  pDVar2 = (this->dataLocations).builder.endPtr;
  if ((this->dataLocations).builder.pos == pDVar2) {
    pDVar3 = (this->dataLocations).builder.ptr;
    newSize = 4;
    if (pDVar2 != pDVar3) {
      newSize = (long)pDVar2 - (long)pDVar3 >> 2;
    }
    kj::Vector<capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation>::setCapacity
              (&this->dataLocations,newSize);
  }
  RVar5.offset = uVar4;
  RVar5.lgSize = lgSize;
  *(this->dataLocations).builder.pos = RVar5;
  ppRVar1 = &(this->dataLocations).builder.pos;
  *ppRVar1 = *ppRVar1 + 1;
  return uVar4;
}

Assistant:

uint addNewDataLocation(uint lgSize) {
      // Add a whole new data location to the union with the given size.

      uint offset = parent.addData(lgSize);
      dataLocations.add(DataLocation { lgSize, offset });
      return offset;
    }